

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

int use_psk_identity_hint(UniquePtr<char> *out,char *identity_hint)

{
  size_t sVar1;
  char *__p;
  
  if (identity_hint == (char *)0x0) {
    std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)out,(pointer)0x0);
  }
  else {
    sVar1 = strlen(identity_hint);
    if (0x80 < sVar1) {
      ERR_put_error(0x10,0,0x88,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0xa27);
      return 0;
    }
    std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)out,(pointer)0x0);
    if (*identity_hint != '\0') {
      __p = OPENSSL_strdup(identity_hint);
      std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)out,__p);
      if ((out->_M_t).super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static int use_psk_identity_hint(UniquePtr<char> *out,
                                 const char *identity_hint) {
  if (identity_hint != NULL && strlen(identity_hint) > PSK_MAX_IDENTITY_LEN) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DATA_LENGTH_TOO_LONG);
    return 0;
  }

  // Clear currently configured hint, if any.
  out->reset();

  // Treat the empty hint as not supplying one. Plain PSK makes it possible to
  // send either no hint (omit ServerKeyExchange) or an empty hint, while
  // ECDHE_PSK can only spell empty hint. Having different capabilities is odd,
  // so we interpret empty and missing as identical.
  if (identity_hint != NULL && identity_hint[0] != '\0') {
    out->reset(OPENSSL_strdup(identity_hint));
    if (*out == nullptr) {
      return 0;
    }
  }

  return 1;
}